

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O2

char * ngx_http_uwsgi_pass(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  void *pvVar2;
  ngx_int_t nVar3;
  ngx_http_upstream_srv_conf_t *pnVar4;
  ngx_http_uwsgi_loc_conf_t *uwcf;
  long lVar5;
  undefined1 local_108 [80];
  ngx_sockaddr_t local_b8;
  
  if (*conf != 0) {
    return "is duplicate";
  }
  if (*(long *)((long)conf + 0x220) != 0) {
    return "is duplicate";
  }
  plVar1 = *(long **)(*(long *)((long)cf->ctx + 0x10) + ngx_http_core_module.ctx_index * 8);
  plVar1[9] = (long)ngx_http_uwsgi_handler;
  pvVar2 = cf->args->elts;
  local_108._40_8_ = ngx_http_script_variables_count((ngx_str_t *)((long)pvVar2 + 0x10));
  if ((u_char *)local_108._40_8_ != (u_char *)0x0) {
    local_108._24_8_ = (long)conf + 0x220;
    local_108._16_8_ = (ngx_array_t **)0x0;
    local_108._64_8_ = 0;
    local_108._72_8_ = (void *)0x0;
    local_108._48_8_ = 0;
    local_108._56_8_ = (u_char *)0x0;
    local_108._32_8_ = (long)conf + 0x228;
    local_b8._0_8_ = 6;
    local_108._0_8_ = cf;
    local_108._8_8_ = (ngx_str_t *)((long)pvVar2 + 0x10);
    nVar3 = ngx_http_script_compile((ngx_http_script_compile_t *)local_108);
    return (char *)-(ulong)(nVar3 != 0);
  }
  lVar5 = 8;
  nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),"uwsgi://",8);
  if (nVar3 != 0) {
    nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),(u_char *)"suwsgi://",9);
    if (nVar3 == 0) {
      ngx_conf_log_error(1,cf,0,"suwsgi protocol requires SSL support");
      return (char *)0xffffffffffffffff;
    }
    lVar5 = 0;
  }
  memset(local_108 + 0x10,0,200);
  local_108._0_8_ = *(long *)((long)pvVar2 + 0x10) - lVar5;
  local_108._8_8_ = lVar5 + *(long *)((long)pvVar2 + 0x18);
  local_108[0x48] = 4;
  pnVar4 = ngx_http_upstream_add(cf,(ngx_url_t *)local_108,0);
  *(ngx_http_upstream_srv_conf_t **)conf = pnVar4;
  if (pnVar4 == (ngx_http_upstream_srv_conf_t *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  if (*(char *)(plVar1[1] + -1 + *plVar1) == '/') {
    *(byte *)(plVar1 + 3) = *(byte *)(plVar1 + 3) | 0x20;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_uwsgi_pass(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    size_t                      add;
    ngx_url_t                   u;
    ngx_str_t                  *value, *url;
    ngx_uint_t                  n;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_script_compile_t   sc;

    if (uwcf->upstream.upstream || uwcf->uwsgi_lengths) {
        return "is duplicate";
    }

    clcf = ngx_http_conf_get_module_loc_conf(cf, ngx_http_core_module);
    clcf->handler = ngx_http_uwsgi_handler;

    value = cf->args->elts;

    url = &value[1];

    n = ngx_http_script_variables_count(url);

    if (n) {

        ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

        sc.cf = cf;
        sc.source = url;
        sc.lengths = &uwcf->uwsgi_lengths;
        sc.values = &uwcf->uwsgi_values;
        sc.variables = n;
        sc.complete_lengths = 1;
        sc.complete_values = 1;

        if (ngx_http_script_compile(&sc) != NGX_OK) {
            return NGX_CONF_ERROR;
        }

#if (NGX_HTTP_SSL)
        uwcf->ssl = 1;
#endif

        return NGX_CONF_OK;
    }

    if (ngx_strncasecmp(url->data, (u_char *) "uwsgi://", 8) == 0) {
        add = 8;

    } else if (ngx_strncasecmp(url->data, (u_char *) "suwsgi://", 9) == 0) {

#if (NGX_HTTP_SSL)
        add = 9;
        uwcf->ssl = 1;
#else
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "suwsgi protocol requires SSL support");
        return NGX_CONF_ERROR;
#endif

    } else {
        add = 0;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url.len = url->len - add;
    u.url.data = url->data + add;
    u.no_resolve = 1;

    uwcf->upstream.upstream = ngx_http_upstream_add(cf, &u, 0);
    if (uwcf->upstream.upstream == NULL) {
        return NGX_CONF_ERROR;
    }

    if (clcf->name.data[clcf->name.len - 1] == '/') {
        clcf->auto_redirect = 1;
    }

    return NGX_CONF_OK;
}